

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_get_index(void **param_1)

{
  roaring64_bitmap_t *r_00;
  uint64_t index;
  uint64_t i_1;
  uint64_t i;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000060;
  uint64_t *in_stack_00000078;
  uint64_t in_stack_00000080;
  roaring64_bitmap_t *in_stack_00000088;
  int line;
  char *file;
  char *expression;
  
  r_00 = roaring64_bitmap_create();
  for (expression = (char *)0x0; expression < (char *)0x64; expression = expression + 1) {
    roaring64_bitmap_add(r_00,(uint64_t)expression);
  }
  for (file = (char *)0x0; file < (char *)0x64; file = file + 1) {
    line = 0;
    roaring64_bitmap_get_index(in_stack_00000088,in_stack_00000080,in_stack_00000078);
    _assert_true((unsigned_long)r_00,expression,file,line);
    _assert_int_equal((unsigned_long)r_00,(unsigned_long)expression,file,line);
    roaring64_bitmap_get_index(in_stack_00000088,in_stack_00000080,in_stack_00000078);
    _assert_true((unsigned_long)r_00,expression,file,line);
  }
  roaring64_bitmap_free(in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_get_index) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        uint64_t index = 0;
        assert_true(roaring64_bitmap_get_index(r, i * 1000, &index));
        assert_int_equal(index, i);
        assert_false(roaring64_bitmap_get_index(r, i * 1000 + 1, &index));
    }
    roaring64_bitmap_free(r);
}